

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Saig_Bmc_t *
Saig_BmcManStart(Aig_Man_t *pAig,int nFramesMax,int nNodesMax,int nConfMaxOne,int nConfMaxAll,
                int fVerbose,int fUseSatoko)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  Saig_Bmc_t *p_00;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *pVVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pNode;
  satoko_t *psVar8;
  sat_solver *psVar9;
  undefined1 local_a8 [8];
  satoko_opts_t opts;
  int Lit;
  int i;
  Aig_Obj_t *pObj;
  Saig_Bmc_t *p;
  int fVerbose_local;
  int nConfMaxAll_local;
  int nConfMaxOne_local;
  int nNodesMax_local;
  int nFramesMax_local;
  Aig_Man_t *pAig_local;
  
  p_00 = (Saig_Bmc_t *)malloc(0x88);
  memset(p_00,0,0x88);
  p_00->nFramesMax = nFramesMax;
  p_00->nNodesMax = nNodesMax;
  p_00->nConfMaxOne = nConfMaxOne;
  p_00->nConfMaxAll = nConfMaxAll;
  p_00->fVerbose = fVerbose;
  p_00->pAig = pAig;
  iVar3 = Aig_ManObjNumMax(pAig);
  p_00->nObjs = iVar3;
  pVVar4 = Vec_PtrAlloc(100);
  p_00->vAig2Frm = pVVar4;
  pVVar5 = Vec_IntAlloc(0);
  p_00->vObj2Var = pVVar5;
  Vec_IntFill(p_00->vObj2Var,p_00->nObjs,0);
  pAVar6 = Aig_ManStart(p_00->nObjs);
  p_00->pFrm = pAVar6;
  opts.verbose = '\0';
  opts.no_simplify = '\0';
  opts._102_2_ = 0;
  for (; uVar1 = opts._100_4_, iVar3 = Saig_ManRegNum(pAig), uVar2 = opts._100_4_,
      (int)uVar1 < iVar3; opts._100_4_ = opts._100_4_ + 1) {
    pVVar4 = pAig->vCis;
    iVar3 = Saig_ManPiNum(pAig);
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar4,uVar2 + iVar3);
    pNode = Aig_ManConst0(p_00->pFrm);
    Saig_BmcObjSetFrame(p_00,pAVar7,0,pNode);
  }
  p_00->nSatVars = 1;
  opts.garbage_max_ratio = (float)toLit(p_00->nSatVars);
  if (fUseSatoko == 0) {
    psVar9 = sat_solver_new();
    p_00->pSat = psVar9;
    p_00->pSat->nLearntStart = 10000;
    p_00->pSat->nLearntDelta = 5000;
    p_00->pSat->nLearntRatio = 0x4b;
    p_00->pSat->nLearntMax = p_00->pSat->nLearntStart;
    sat_solver_setnvars(p_00->pSat,2000);
    sat_solver_addclause(p_00->pSat,(lit *)&opts.garbage_max_ratio,(lit *)&opts.verbose);
  }
  else {
    satoko_default_opts((satoko_opts_t *)local_a8);
    local_a8 = (undefined1  [8])(long)nConfMaxOne;
    psVar8 = satoko_create();
    p_00->pSat2 = psVar8;
    satoko_configure(p_00->pSat2,(satoko_opts_t *)local_a8);
    satoko_setnvars(p_00->pSat2,2000);
    satoko_add_clause(p_00->pSat2,(int *)&opts.garbage_max_ratio,1);
  }
  pAVar7 = Aig_ManConst1(p_00->pFrm);
  iVar3 = p_00->nSatVars;
  p_00->nSatVars = iVar3 + 1;
  Saig_BmcSetSatNum(p_00,pAVar7,iVar3);
  pVVar4 = Vec_PtrAlloc(1000);
  p_00->vTargets = pVVar4;
  pVVar5 = Vec_IntAlloc(1000);
  p_00->vVisited = pVVar5;
  p_00->iOutputFail = -1;
  p_00->iFrameFail = -1;
  return p_00;
}

Assistant:

Saig_Bmc_t * Saig_BmcManStart( Aig_Man_t * pAig, int nFramesMax, int nNodesMax, int nConfMaxOne, int nConfMaxAll, int fVerbose, int fUseSatoko )
{
    Saig_Bmc_t * p;
    Aig_Obj_t * pObj;
    int i, Lit;
//    assert( Aig_ManRegNum(pAig) > 0 );
    p = (Saig_Bmc_t *)ABC_ALLOC( char, sizeof(Saig_Bmc_t) );
    memset( p, 0, sizeof(Saig_Bmc_t) );
    // set parameters
    p->nFramesMax   = nFramesMax;
    p->nNodesMax    = nNodesMax;
    p->nConfMaxOne  = nConfMaxOne;
    p->nConfMaxAll  = nConfMaxAll;
    p->fVerbose     = fVerbose;
    p->pAig         = pAig;
    p->nObjs        = Aig_ManObjNumMax(pAig);
    // create node and variable mappings
    p->vAig2Frm     = Vec_PtrAlloc( 100 );
    p->vObj2Var     = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vObj2Var, p->nObjs, 0 );
    // start the AIG manager and map primary inputs
    p->pFrm         = Aig_ManStart( p->nObjs );
    Saig_ManForEachLo( pAig, pObj, i )
        Saig_BmcObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrm) ); 
    // create SAT solver
    p->nSatVars     = 1;
    Lit = toLit( p->nSatVars );
    if ( fUseSatoko )
    {
        satoko_opts_t opts;
        satoko_default_opts(&opts);
        opts.conf_limit = nConfMaxOne;
        p->pSat2 = satoko_create();  
        satoko_configure(p->pSat2, &opts);
        satoko_setnvars(p->pSat2, 2000);
        satoko_add_clause( p->pSat2, &Lit, 1 );
    }
    else
    {
        p->pSat = sat_solver_new();
        p->pSat->nLearntStart = 10000;//p->pPars->nLearnedStart;
        p->pSat->nLearntDelta =  5000;//p->pPars->nLearnedDelta;
        p->pSat->nLearntRatio =    75;//p->pPars->nLearnedPerce;
        p->pSat->nLearntMax   = p->pSat->nLearntStart;
        sat_solver_setnvars( p->pSat, 2000 );
        sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    }
    Saig_BmcSetSatNum( p, Aig_ManConst1(p->pFrm), p->nSatVars++ );
    // other data structures
    p->vTargets     = Vec_PtrAlloc( 1000 );
    p->vVisited     = Vec_IntAlloc( 1000 );
    p->iOutputFail  = -1;
    p->iFrameFail   = -1;
    return p;
}